

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IsLocaleValue(Fts5Config *pConfig,sqlite3_value *pVal)

{
  int iVar1;
  void *__s1;
  sqlite3_value *in_RSI;
  long in_RDI;
  int nBlob;
  u8 *pBlob;
  int ret;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = sqlite3_value_type(in_RSI);
  if (iVar1 == 4) {
    __s1 = sqlite3_value_blob((sqlite3_value *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    iVar1 = sqlite3_value_bytes((sqlite3_value *)0x26cade);
    if ((0x10 < iVar1) &&
       (iVar1 = memcmp(__s1,(void *)(*(long *)(in_RDI + 8) + 0x60),0x10), iVar1 == 0)) {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int sqlite3Fts5IsLocaleValue(Fts5Config *pConfig, sqlite3_value *pVal){
  int ret = 0;
  if( sqlite3_value_type(pVal)==SQLITE_BLOB ){
    /* Call sqlite3_value_bytes() after sqlite3_value_blob() in this case.
    ** If the blob was created using zeroblob(), then sqlite3_value_blob()
    ** may call malloc(). If this malloc() fails, then the values returned
    ** by both value_blob() and value_bytes() will be 0. If value_bytes() were
    ** called first, then the NULL pointer returned by value_blob() might
    ** be dereferenced.  */
    const u8 *pBlob = sqlite3_value_blob(pVal);
    int nBlob = sqlite3_value_bytes(pVal);
    if( nBlob>FTS5_LOCALE_HDR_SIZE
     && 0==memcmp(pBlob, FTS5_LOCALE_HDR(pConfig), FTS5_LOCALE_HDR_SIZE)
    ){
      ret = 1;
    }
  }
  return ret;
}